

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

bool __thiscall
google::protobuf::Reflection::LookupMapValue
          (Reflection *this,Message *message,FieldDescriptor *field,MapKey *key,
          MapValueConstRef *val)

{
  MapValueConstRef *this_00;
  bool bVar1;
  CppType type;
  int iVar2;
  Descriptor *this_01;
  FieldDescriptor *this_02;
  MapFieldBase *pMVar3;
  allocator local_51;
  string local_50;
  MapValueConstRef *local_30;
  MapValueConstRef *val_local;
  MapKey *key_local;
  FieldDescriptor *field_local;
  Message *message_local;
  Reflection *this_local;
  
  local_30 = val;
  val_local = (MapValueConstRef *)key;
  key_local = (MapKey *)field;
  field_local = (FieldDescriptor *)message;
  message_local = (Message *)this;
  bVar1 = anon_unknown_0::IsMapFieldInApi(field);
  if (!bVar1) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,(FieldDescriptor *)key_local,"\"LookupMapValue\"",
               "Field is not a map field.");
  }
  this_00 = local_30;
  this_01 = FieldDescriptor::message_type((FieldDescriptor *)key_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"value",&local_51);
  this_02 = Descriptor::FindFieldByName(this_01,&local_50);
  type = FieldDescriptor::cpp_type(this_02);
  MapValueConstRef::SetType(this_00,type);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pMVar3 = GetRaw<google::protobuf::internal::MapFieldBase>
                     (this,(Message *)field_local,(FieldDescriptor *)key_local);
  iVar2 = (*pMVar3->_vptr_MapFieldBase[4])(pMVar3,val_local,local_30);
  return (bool)((byte)iVar2 & 1);
}

Assistant:

bool Reflection::LookupMapValue(const Message& message,
                                const FieldDescriptor* field, const MapKey& key,
                                MapValueConstRef* val) const {
  USAGE_CHECK(IsMapFieldInApi(field), "LookupMapValue",
              "Field is not a map field.");
  val->SetType(field->message_type()->FindFieldByName("value")->cpp_type());
  return GetRaw<MapFieldBase>(message, field).LookupMapValue(key, val);
}